

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

string * __thiscall
cmTarget::GetMacContentDirectory
          (string *__return_storage_ptr__,cmTarget *this,string *config,bool implib)

{
  bool bVar1;
  string local_58;
  byte local_35;
  bool contentOnly;
  undefined1 local_22;
  undefined1 local_21;
  string *psStack_20;
  bool implib_local;
  string *config_local;
  cmTarget *this_local;
  string *fpath;
  
  local_22 = 0;
  local_21 = implib;
  psStack_20 = config;
  config_local = (string *)this;
  this_local = (cmTarget *)__return_storage_ptr__;
  GetDirectory(__return_storage_ptr__,this,config,implib);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"/");
  local_35 = 1;
  bVar1 = IsFrameworkOnApple(this);
  if (bVar1) {
    local_35 = 0;
  }
  BuildMacContentDirectory(&local_58,this,__return_storage_ptr__,psStack_20,(bool)(local_35 & 1));
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

std::string cmTarget::GetMacContentDirectory(const std::string& config,
                                             bool implib) const
{
  // Start with the output directory for the target.
  std::string fpath = this->GetDirectory(config, implib);
  fpath += "/";
  bool contentOnly = true;
  if(this->IsFrameworkOnApple())
    {
    // additional files with a framework go into the version specific
    // directory
    contentOnly = false;
    }
  fpath = this->BuildMacContentDirectory(fpath, config, contentOnly);
  return fpath;
}